

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

HighsStatus normaliseHessian(HighsOptions *options,HighsHessian *hessian)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *this;
  int *in_RSI;
  long in_RDI;
  HighsLogOptions *pHVar8;
  double value_1;
  HighsInt iRow_6;
  HighsInt ix_1;
  bool exploit_sparsity;
  HighsInt to_ix;
  double density;
  double kDensityTolerance;
  HighsInt kDimTolerance;
  bool ok_value;
  double abs_value;
  double value;
  HighsInt iRow_5;
  HighsInt ix;
  HighsInt iRow_4;
  HighsInt iEl_3;
  HighsInt iRow_3;
  HighsInt iEl_2;
  HighsInt column_num_nz;
  HighsInt iCol_1;
  double min_small_value;
  double max_small_value;
  HighsInt num_small_values;
  double small_matrix_value;
  bool check_column_value_zero;
  vector<int,_std::allocator<int>_> column_index;
  vector<double,_std::allocator<double>_> column_value;
  HighsInt normalised_size;
  HighsInt normalised_num_nz;
  HighsHessian normalised;
  HighsInt iRow_2;
  HighsInt iRowEl;
  HighsInt iRow_1;
  HighsInt iEl_1;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt iEl;
  vector<int,_std::allocator<int>_> qr_length;
  HighsHessian transpose;
  bool warning_found;
  HighsInt hessian_num_nz;
  HighsInt dim;
  HighsStatus return_status;
  HighsHessian *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd90;
  value_type in_stack_fffffffffffffd94;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  value_type in_stack_fffffffffffffda8;
  HighsHessian *in_stack_fffffffffffffdb0;
  vector<int,_std::allocator<int>_> *sorted_data0;
  HighsVarType *in_stack_fffffffffffffe20;
  HighsVarType *pHVar9;
  value_type in_stack_fffffffffffffe28;
  value_type vVar10;
  int in_stack_fffffffffffffe2c;
  int iVar11;
  value_type local_1a8;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  HighsLogOptions *local_178;
  HighsLogOptions *local_170;
  uint local_164;
  undefined8 local_160;
  undefined1 local_151;
  undefined8 local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<double,_std::allocator<double>_> local_130;
  int local_118;
  int local_114;
  int local_110;
  undefined4 local_10c;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  vector<int,_std::allocator<int>_> local_a0;
  int local_78;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  byte local_25;
  int local_24;
  int local_20;
  HighsStatus local_1c;
  int *local_18;
  long local_10;
  HighsStatus local_4;
  
  local_1c = 0;
  local_20 = *in_RSI;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_20);
  local_24 = *pvVar6;
  if (local_24 < 1) {
    local_4 = kOk;
  }
  else {
    local_25 = 0;
    HighsHessian::HighsHessian(in_stack_fffffffffffffdb0);
    local_78 = local_20;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               (size_type)in_stack_fffffffffffffda8);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               (size_type)in_stack_fffffffffffffda8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
               (size_type)in_stack_fffffffffffffda8);
    sorted_data0 = &local_a0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6b76d0);
    local_a4 = 0;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (size_type)in_stack_fffffffffffffd88,(value_type_conflict2 *)0x6b76f8);
    local_1a8 = in_stack_fffffffffffffda8;
    for (local_a8 = 0; local_a8 < local_24; local_a8 = local_a8 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)local_a8);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)*pvVar6);
      *pvVar6 = *pvVar6 + 1;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,0);
    *pvVar6 = 0;
    for (local_ac = 0; local_ac < local_20; local_ac = local_ac + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_ac);
      iVar11 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_ac);
      iVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)(local_ac + 1));
      *pvVar6 = iVar11 + iVar3;
    }
    for (local_b0 = 0; local_b0 < local_20; local_b0 = local_b0 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 2),(long)local_b0);
      for (local_b4 = *pvVar6; iVar11 = local_b4,
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 2),
                              (long)(local_b0 + 1)), iVar11 < *pvVar6; local_b4 = local_b4 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)local_b4);
        local_b8 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_b8);
        iVar11 = local_b0;
        local_bc = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_bc);
        *pvVar6 = iVar11;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                            (long)local_b4);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_bc);
        *pvVar7 = vVar1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_b8);
        *pvVar6 = *pvVar6 + 1;
      }
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,0);
    *pvVar6 = 0;
    for (local_c0 = 0; local_c0 < local_20; local_c0 = local_c0 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_c0);
      iVar11 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_c0);
      iVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)(local_c0 + 1));
      *pvVar6 = iVar11 + iVar3;
    }
    HighsHessian::HighsHessian(in_stack_fffffffffffffdb0);
    local_10c = 2;
    local_114 = 0;
    local_118 = local_24;
    local_110 = local_20;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,(size_type)local_1a8);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,(size_type)local_1a8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
               (size_type)local_1a8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x6b7b14);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6b7b26);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,(size_type)local_1a8);
    local_150 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (size_type)in_stack_fffffffffffffd88,(value_type_conflict1 *)0x6b7b63);
    local_151 = 0;
    local_160 = 0;
    local_164 = 0;
    local_170 = (HighsLogOptions *)0x0;
    local_178 = (HighsLogOptions *)0x7ff0000000000000;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,0);
    *pvVar6 = 0;
    for (local_17c = 0; local_17c < local_20; local_17c = local_17c + 1) {
      local_180 = 0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 2),(long)local_17c);
      for (local_184 = *pvVar6; iVar11 = local_184,
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 2),
                              (long)(local_17c + 1)), iVar11 < *pvVar6; local_184 = local_184 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)local_184);
        local_188 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                            (long)local_184);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_130,(long)local_188);
        iVar11 = local_188;
        *pvVar7 = vVar1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_148,(long)local_180);
        *pvVar6 = iVar11;
        local_180 = local_180 + 1;
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_17c);
      for (local_18c = *pvVar6; iVar11 = local_18c,
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_70,(long)(local_17c + 1)), iVar11 < *pvVar6;
          local_18c = local_18c + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_18c);
        local_190 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_130,(long)local_190);
        if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_40,(long)local_18c);
          dVar2 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_130,(long)local_190);
          *pvVar7 = dVar2 + *pvVar7;
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_40,(long)local_18c);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_130,(long)local_190);
          iVar11 = local_190;
          *pvVar7 = vVar1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_148,(long)local_180);
          *pvVar6 = iVar11;
          local_180 = local_180 + 1;
        }
      }
      if (local_118 < local_114 + local_180) {
        local_194 = local_114 + local_180;
        local_198 = local_118 * 2;
        this = (vector<double,_std::allocator<double>_> *)std::max<int>(&local_194,&local_198);
        local_118 = *(int *)&(this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)this,(size_type)local_1a8);
        std::vector<double,_std::allocator<double>_>::resize(this,(size_type)local_1a8);
      }
      for (local_19c = 0; local_19c < local_180; local_19c = local_19c + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_148,(long)local_19c);
        iVar11 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_130,(long)iVar11);
        local_1a8 = *pvVar7 * 0.5;
        pHVar8 = (HighsLogOptions *)ABS(local_1a8);
        if ((double)pHVar8 <= 0.0) {
          local_1a8 = 0.0;
          if ((double)local_170 < (double)pHVar8) {
            local_170 = pHVar8;
          }
          if ((double)pHVar8 < (double)local_178) {
            local_178 = pHVar8;
          }
          local_164 = local_164 + 1;
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_130,(long)iVar11);
        *pvVar7 = local_1a8;
      }
      bVar4 = 10 < local_20;
      bVar5 = ((double)local_180 * 1.0) / ((double)local_20 * 1.0) < 0.1;
      in_stack_fffffffffffffda7 = bVar4 && bVar5;
      iVar11 = local_20;
      if (bVar4 && bVar5) {
        iVar11 = local_180;
        sortSetData(local_180,
                    (vector<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                    in_stack_fffffffffffffe20,(HighsVarType *)sorted_data0);
      }
      for (in_stack_fffffffffffffe2c = 0; in_stack_fffffffffffffe2c < iVar11;
          in_stack_fffffffffffffe2c = in_stack_fffffffffffffe2c + 1) {
        in_stack_fffffffffffffe28 = in_stack_fffffffffffffe2c;
        if (bVar4 && bVar5) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_148,(long)in_stack_fffffffffffffe2c);
          in_stack_fffffffffffffe28 = *pvVar6;
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_130,(long)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe20 = (HighsVarType *)*pvVar7;
        if (((double)in_stack_fffffffffffffe20 != 0.0) || (NAN((double)in_stack_fffffffffffffe20)))
        {
          vVar10 = in_stack_fffffffffffffe28;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_f0,(long)local_114);
          *pvVar6 = in_stack_fffffffffffffe28;
          pHVar9 = in_stack_fffffffffffffe20;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_d8,(long)local_114);
          *pvVar7 = (value_type)in_stack_fffffffffffffe20;
          local_114 = local_114 + 1;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_130,(long)vVar10)
          ;
          *pvVar7 = 0.0;
          in_stack_fffffffffffffd94 = in_stack_fffffffffffffe28;
          in_stack_fffffffffffffe20 = pHVar9;
          in_stack_fffffffffffffe28 = vVar10;
        }
      }
      in_stack_fffffffffffffd90 = local_114;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)(local_17c + 1));
      *pvVar6 = in_stack_fffffffffffffd90;
    }
    if (local_164 != 0) {
      highsLogUser(local_178,(HighsLogType)local_170,(char *)0x0,local_10 + 0x380,4,
                   "Normalised Hessian contains %d |values| in [%g, %g] less than %g: ignored\n",
                   (ulong)local_164);
      local_25 = 1;
    }
    HighsHessian::operator=
              ((HighsHessian *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    local_1c = (HighsStatus)((local_25 & 1) != 0);
    local_4 = local_1c;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    HighsHessian::~HighsHessian
              ((HighsHessian *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    HighsHessian::~HighsHessian
              ((HighsHessian *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  return local_4;
}

Assistant:

HighsStatus normaliseHessian(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Only relevant for a Hessian with format HessianFormat::kSquare
  assert(hessian.format_ == HessianFormat::kSquare);
  // Normalise the Hessian to be (Q + Q^T)/2, where Q is the matrix
  // supplied. This guarantees that what's used internally is
  // symmetric.
  //
  // So someone preferring to supply only the upper triangle would
  // have to double its values..
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  const HighsInt hessian_num_nz = hessian.start_[dim];
  if (hessian_num_nz <= 0) return HighsStatus::kOk;
  bool warning_found = false;

  HighsHessian transpose;
  transpose.dim_ = dim;
  transpose.start_.resize(dim + 1);
  transpose.index_.resize(hessian_num_nz);
  transpose.value_.resize(hessian_num_nz);
  // Form transpose of Hessian
  vector<HighsInt> qr_length;
  qr_length.assign(dim, 0);
  for (HighsInt iEl = 0; iEl < hessian_num_nz; iEl++)
    qr_length[hessian.index_[iEl]]++;

  transpose.start_[0] = 0;
  for (HighsInt iRow = 0; iRow < dim; iRow++)
    transpose.start_[iRow + 1] = transpose.start_[iRow] + qr_length[iRow];
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt iRowEl = transpose.start_[iRow];
      transpose.index_[iRowEl] = iCol;
      transpose.value_[iRowEl] = hessian.value_[iEl];
      transpose.start_[iRow]++;
    }
  }

  transpose.start_[0] = 0;
  for (HighsInt iRow = 0; iRow < dim; iRow++)
    transpose.start_[iRow + 1] = transpose.start_[iRow] + qr_length[iRow];
  // Instantiate a square format Hessian in which to accumulate (Q + Q^T)/2
  HighsHessian normalised;
  normalised.format_ = HessianFormat::kSquare;
  HighsInt normalised_num_nz = 0;
  HighsInt normalised_size = hessian_num_nz;
  normalised.dim_ = dim;
  normalised.start_.resize(dim + 1);
  normalised.index_.resize(normalised_size);
  normalised.value_.resize(normalised_size);
  vector<double> column_value;
  vector<HighsInt> column_index;
  column_index.resize(dim);
  column_value.assign(dim, 0.0);
  const bool check_column_value_zero = false;
  const double small_matrix_value = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  normalised.start_[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt column_num_nz = 0;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      column_value[iRow] = hessian.value_[iEl];
      column_index[column_num_nz] = iRow;
      column_num_nz++;
    }
    for (HighsInt iEl = transpose.start_[iCol];
         iEl < transpose.start_[iCol + 1]; iEl++) {
      HighsInt iRow = transpose.index_[iEl];
      if (column_value[iRow]) {
        column_value[iRow] += transpose.value_[iEl];
      } else {
        column_value[iRow] = transpose.value_[iEl];
        column_index[column_num_nz] = iRow;
        column_num_nz++;
      }
    }
    if (normalised_num_nz + column_num_nz > normalised_size) {
      normalised_size =
          std::max(normalised_num_nz + column_num_nz, 2 * normalised_size);
      normalised.index_.resize(normalised_size);
      normalised.value_.resize(normalised_size);
    }
    // Halve the values, zeroing and accounting for any small ones
    for (HighsInt ix = 0; ix < column_num_nz; ix++) {
      HighsInt iRow = column_index[ix];
      double value = 0.5 * column_value[iRow];
      double abs_value = std::fabs(value);
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        value = 0;
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      column_value[iRow] = value;
    }
    // Decide whether to exploit sparsity in extracting the indices
    // and values of nonzeros
    const HighsInt kDimTolerance = 10;
    const double kDensityTolerance = 0.1;
    const double density = (1.0 * column_num_nz) / (1.0 * dim);
    HighsInt to_ix = dim;
    const bool exploit_sparsity =
        dim > kDimTolerance && density < kDensityTolerance;
    if (exploit_sparsity) {
      // Exploit sparsity
      to_ix = column_num_nz;
      sortSetData(column_num_nz, column_index, NULL, NULL);
    } else {
      to_ix = dim;
    }
    for (HighsInt ix = 0; ix < to_ix; ix++) {
      HighsInt iRow;
      if (exploit_sparsity) {
        iRow = column_index[ix];
      } else {
        iRow = ix;
      }
      double value = column_value[iRow];
      if (value) {
        normalised.index_[normalised_num_nz] = iRow;
        normalised.value_[normalised_num_nz] = value;
        normalised_num_nz++;
        column_value[iRow] = 0;
      }
    }
    if (check_column_value_zero) {
      for (HighsInt iRow = 0; iRow < dim; iRow++)
        assert(column_value[iRow] == 0);
    }
    normalised.start_[iCol + 1] = normalised_num_nz;
  }
  if (num_small_values) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Normalised Hessian contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] "
                 "less than %g: ignored\n",
                 num_small_values, min_small_value, max_small_value,
                 small_matrix_value);
    warning_found = true;
  }
  // Replace the Hessian by the normalised form
  hessian = normalised;
  assert(hessian.format_ == HessianFormat::kSquare);
  if (warning_found)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;

  return return_status;
}